

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O2

int __thiscall p2t::Triangle::Index(Triangle *this,Point *p)

{
  int iVar1;
  
  if (this->points_[0] == p) {
    return 0;
  }
  if (this->points_[1] == p) {
    iVar1 = 1;
  }
  else {
    if (this->points_[2] != p) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/poly2tri/poly2tri/common/shapes.cc"
                    ,0xa2,"int p2t::Triangle::Index(const Point *)");
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int Triangle::Index(const Point* p)
{
  if (p == points_[0]) {
    return 0;
  } else if (p == points_[1]) {
    return 1;
  } else if (p == points_[2]) {
    return 2;
  }
  assert(0);
  return -1;
}